

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_ARB1_destarg_string(Context *ctx,char *buf,size_t buflen)

{
  int iVar1;
  undefined1 local_98 [8];
  char pred [32];
  ulong uStack_70;
  int scalar;
  size_t i;
  char *pcStack_60;
  char writemask_str [6];
  char *regtype_str;
  char regnum_str [16];
  char *local_40;
  char *pp_str;
  char *sat_str;
  DestArgInfo *arg;
  size_t buflen_local;
  char *buf_local;
  Context *ctx_local;
  
  *buf = '\0';
  pp_str = "";
  if (((ctx->dest_arg).result_mod & 1U) != 0) {
    if (ctx->profile_supports_nv4 == 0) {
      iVar1 = shader_is_pixel(ctx);
      if (iVar1 != 0) {
        pp_str = "_SAT";
      }
    }
    else {
      pp_str = ".SAT";
    }
  }
  local_40 = "";
  if ((((ctx->dest_arg).result_mod & 2U) != 0) && (ctx->profile_supports_nv4 != 0)) {
    local_40 = "H";
  }
  if (((ctx->dest_arg).result_mod & 4U) != 0) {
    __assert_fail("(arg->result_mod & MOD_CENTROID) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1a1d,"const char *make_ARB1_destarg_string(Context *, char *, const size_t)");
  }
  pcStack_60 = get_ARB1_register_string
                         (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,(char *)&regtype_str,
                          0x10);
  if (pcStack_60 == (char *)0x0) {
    fail(ctx,"Unknown destination register type.");
  }
  else {
    uStack_70 = 0;
    pred._28_4_ = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
    if ((pred._28_4_ == 0) && (iVar1 = writemask_xyzw((ctx->dest_arg).writemask), iVar1 == 0)) {
      uStack_70 = 1;
      i._2_1_ = 0x2e;
      if ((ctx->dest_arg).writemask0 != 0) {
        uStack_70 = 2;
        i._3_1_ = 0x78;
      }
      if ((ctx->dest_arg).writemask1 != 0) {
        *(undefined1 *)((long)&i + uStack_70 + 2) = 0x79;
        uStack_70 = uStack_70 + 1;
      }
      if ((ctx->dest_arg).writemask2 != 0) {
        *(undefined1 *)((long)&i + uStack_70 + 2) = 0x7a;
        uStack_70 = uStack_70 + 1;
      }
      if ((ctx->dest_arg).writemask3 != 0) {
        *(undefined1 *)((long)&i + uStack_70 + 2) = 0x77;
        uStack_70 = uStack_70 + 1;
      }
    }
    *(undefined1 *)((long)&i + uStack_70 + 2) = 0;
    if (5 < uStack_70) {
      __assert_fail("i < sizeof (writemask_str)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1a35,"const char *make_ARB1_destarg_string(Context *, char *, const size_t)")
      ;
    }
    memset(local_98,0,0x20);
    if (ctx->predicated == 0) {
      snprintf(buf,buflen,"%s%s %s%s%s",local_40,pp_str,pcStack_60,&regtype_str,(long)&i + 2);
    }
    else {
      fail(ctx,"dest register predication currently unsupported in arb1");
    }
  }
  return buf;
}

Assistant:

static const char *make_ARB1_destarg_string(Context *ctx, char *buf,
                                            const size_t buflen)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    *buf = '\0';

    const char *sat_str = "";
    if (arg->result_mod & MOD_SATURATE)
    {
        // nv4 can use ".SAT" in all program types.
        // For less than nv4, the "_SAT" modifier is only available in
        //  fragment shaders. Every thing else will fake it later in
        //  emit_ARB1_dest_modifiers() ...
        if (support_nv4(ctx))
            sat_str = ".SAT";
        else if (shader_is_pixel(ctx))
            sat_str = "_SAT";
    } // if

    const char *pp_str = "";
    if (arg->result_mod & MOD_PP)
    {
        // Most ARB1 profiles can't do partial precision (MOD_PP), but that's
        //  okay. The spec says lots of Direct3D implementations ignore the
        //  flag anyhow.
        if (support_nv4(ctx))
            pp_str = "H";
    } // if

    // CENTROID only allowed in DCL opcodes, which shouldn't come through here.
    assert((arg->result_mod & MOD_CENTROID) == 0);

    char regnum_str[16];
    const char *regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                                       arg->regnum, regnum_str,
                                                       sizeof (regnum_str));
    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown destination register type.");
        return buf;
    } // if

    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    //const char *pred_left = "";
    //const char *pred_right = "";
    char pred[32] = { '\0' };
    if (ctx->predicated)
    {
        fail(ctx, "dest register predication currently unsupported in arb1");
        return buf;
        //pred_left = "(";
        //pred_right = ") ";
        make_ARB1_srcarg_string_in_buf(ctx, &ctx->predicate_arg,
                                       pred, sizeof (pred));
    } // if

    snprintf(buf, buflen, "%s%s %s%s%s", pp_str, sat_str,
             regtype_str, regnum_str, writemask_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}